

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O3

CTcStreamAnchor * __thiscall CTcDataStream::find_anchor(CTcDataStream *this,ulong ofs)

{
  CTcStreamAnchor *pCVar1;
  
  pCVar1 = (CTcStreamAnchor *)&this->first_anchor_;
  do {
    pCVar1 = pCVar1->nxt_;
    if (pCVar1 == (CTcStreamAnchor *)0x0) {
      return pCVar1;
    }
  } while (pCVar1->ofs_ != ofs);
  return pCVar1;
}

Assistant:

CTcStreamAnchor *CTcDataStream::find_anchor(ulong ofs) const
{
    CTcStreamAnchor *cur;

    /* scan the anchor list */
    for (cur = first_anchor_ ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this one has the desired offset, return it */
        if (cur->get_ofs() == ofs)
            return cur;
    }

    /* didn't find it */
    return 0;
}